

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

TextureCubeView *
glu::TextureTestUtil::getSubView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *view,int baseLevel,int maxLevel)

{
  ConstPixelBufferAccess *pCVar1;
  uint uVar2;
  TextureCubeView *extraout_RAX;
  int numLevels;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  ConstPixelBufferAccess *levels [6];
  ConstPixelBufferAccess *local_38;
  long alStack_30 [6];
  
  uVar2 = view->m_numLevels - 1;
  uVar3 = uVar2;
  if (baseLevel < (int)uVar2) {
    uVar3 = baseLevel;
  }
  lVar4 = 0;
  if (baseLevel < 0) {
    uVar3 = 0;
  }
  auVar5._0_8_ = (long)(int)uVar3;
  auVar5._8_4_ = uVar3;
  auVar5._12_4_ = (int)uVar3 >> 0x1f;
  do {
    pCVar1 = (view->m_levels + lVar4)[1];
    alStack_30[lVar4 + -1] =
         (long)view->m_levels[lVar4][uVar3].m_size.m_data +
         ((ulong)(uint)((int)uVar3 >> 0x1f) * 0x28 << 0x20) + -8;
    alStack_30[lVar4] =
         (long)pCVar1[auVar5._8_8_ & 0xffffffff].m_size.m_data +
         ((auVar5._8_8_ >> 0x20) * 0x28 << 0x20) + -8;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 6);
  if (maxLevel < (int)uVar2) {
    uVar2 = maxLevel;
  }
  numLevels = 1;
  if ((int)uVar3 <= maxLevel) {
    numLevels = (uVar2 - uVar3) + 1;
  }
  tcu::TextureCubeView::TextureCubeView
            (__return_storage_ptr__,numLevels,(ConstPixelBufferAccess *(*) [6])&local_38);
  return extraout_RAX;
}

Assistant:

static tcu::TextureCubeView getSubView (const tcu::TextureCubeView& view, int baseLevel, int maxLevel)
{
	const int							clampedBase	= de::clamp(baseLevel, 0, view.getNumLevels()-1);
	const int							clampedMax	= de::clamp(maxLevel, clampedBase, view.getNumLevels()-1);
	const int							numLevels	= clampedMax-clampedBase+1;
	const tcu::ConstPixelBufferAccess*	levels[tcu::CUBEFACE_LAST];

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		levels[face] = view.getFaceLevels((tcu::CubeFace)face) + clampedBase;

	return tcu::TextureCubeView(numLevels, levels);
}